

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O3

PaError PaUtil_InitializeBufferProcessor
                  (PaUtilBufferProcessor *bp,int inputChannelCount,
                  PaSampleFormat userInputSampleFormat,PaSampleFormat hostInputSampleFormat,
                  int outputChannelCount,PaSampleFormat userOutputSampleFormat,
                  PaSampleFormat hostOutputSampleFormat,double sampleRate,PaStreamFlags streamFlags,
                  unsigned_long framesPerUserBuffer,unsigned_long framesPerHostBuffer,
                  PaUtilHostBufferSizeMode hostBufferSizeMode,PaStreamCallback *streamCallback,
                  void *userData)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  PaUtilConverter *pPVar5;
  PaUtilZeroer *pPVar6;
  void *pvVar7;
  void **ppvVar8;
  PaUtilChannelDescriptor *pPVar9;
  ulong uVar10;
  unsigned_long uVar11;
  size_t sVar12;
  unsigned_long *local_58;
  unsigned_long *local_50;
  
  uVar1 = (ulong)(uint)outputChannelCount;
  if ((streamFlags & 4) != 0) {
    if (framesPerUserBuffer != 0) {
      return -0x270b;
    }
    if (outputChannelCount < 1) {
      return -0x270b;
    }
    if (inputChannelCount < 1) {
      return -0x270b;
    }
    if (streamCallback == (PaStreamCallback *)0x0) {
      return -0x270b;
    }
  }
  bp->tempInputBuffer = (void *)0x0;
  bp->tempInputBufferPtrs = (void **)0x0;
  bp->tempOutputBuffer = (void *)0x0;
  bp->tempOutputBufferPtrs = (void **)0x0;
  bp->framesPerUserBuffer = framesPerUserBuffer;
  bp->framesPerHostBuffer = framesPerHostBuffer;
  bp->inputChannelCount = inputChannelCount;
  bp->outputChannelCount = outputChannelCount;
  bp->hostBufferSizeMode = hostBufferSizeMode;
  bp->hostInputChannels[0] = (PaUtilChannelDescriptor *)0x0;
  bp->hostInputChannels[1] = (PaUtilChannelDescriptor *)0x0;
  bp->hostOutputChannels[0] = (PaUtilChannelDescriptor *)0x0;
  bp->hostOutputChannels[1] = (PaUtilChannelDescriptor *)0x0;
  if (framesPerUserBuffer == 0) {
    bp->useNonAdaptingProcess = 1;
    bp->initialFramesInTempInputBuffer = 0;
    bp->initialFramesInTempOutputBuffer = 0;
    if (hostBufferSizeMode < paUtilUnknownHostBufferSize) {
      bp->framesPerTempBuffer = framesPerHostBuffer;
    }
    else {
      bp->framesPerTempBuffer = 0x400;
    }
LAB_00105ebb:
    uVar10 = 0;
LAB_00105ebd:
    uVar4 = uVar10;
    uVar10 = 0;
LAB_00105ec0:
    bp->framesInTempInputBuffer = uVar10;
    bp->framesInTempOutputBuffer = uVar4;
    if (0 < inputChannelCount) goto LAB_00105eef;
LAB_00106012:
    local_50 = &bp->framesInTempOutputBuffer;
    if (outputChannelCount < 1) goto LAB_00106132;
    uVar2 = Pa_GetSampleSize(hostOutputSampleFormat);
    if (0 < (int)uVar2) {
      bp->bytesPerHostOutputSample = uVar2;
      uVar2 = Pa_GetSampleSize(userOutputSampleFormat);
      if (0 < (int)uVar2) {
        bp->bytesPerUserOutputSample = uVar2;
        pPVar5 = PaUtil_SelectConverter(userOutputSampleFormat,hostOutputSampleFormat,streamFlags);
        bp->outputConverter = pPVar5;
        pPVar6 = PaUtil_SelectZeroer(hostOutputSampleFormat);
        bp->outputZeroer = pPVar6;
        bp->userOutputIsInterleaved = ~(uint)userOutputSampleFormat >> 0x1f;
        bp->hostOutputIsInterleaved = ~(uint)hostOutputSampleFormat >> 0x1f;
        bp->userOutputSampleFormatIsEqualToHost =
             (uint)(((hostOutputSampleFormat ^ userOutputSampleFormat) & 0xffffffff7fffffff) == 0);
        sVar12 = bp->framesPerTempBuffer * uVar1 * (ulong)bp->bytesPerUserOutputSample;
        pvVar7 = (void *)PaUtil_AllocateMemory(sVar12);
        bp->tempOutputBuffer = pvVar7;
        uVar2 = 0xffffd8f8;
        if (pvVar7 != (void *)0x0) {
          if (*local_50 != 0) {
            memset(pvVar7,0,sVar12);
          }
          if ((int)(uint)userOutputSampleFormat < 0) {
            ppvVar8 = (void **)PaUtil_AllocateMemory(uVar1 * 8);
            bp->tempOutputBufferPtrs = ppvVar8;
            if (ppvVar8 == (void **)0x0) goto LAB_0010618f;
          }
          pPVar9 = (PaUtilChannelDescriptor *)PaUtil_AllocateMemory(uVar1 << 5);
          bp->hostOutputChannels[0] = pPVar9;
          if (pPVar9 != (PaUtilChannelDescriptor *)0x0) {
            bp->hostOutputChannels[1] = pPVar9 + uVar1;
LAB_00106132:
            PaUtil_InitializeTriangularDitherState(&bp->ditherGenerator);
            bp->samplePeriod = 1.0 / sampleRate;
            bp->streamCallback = streamCallback;
            bp->userData = userData;
            return 0;
          }
        }
      }
    }
  }
  else {
    bp->framesPerTempBuffer = framesPerUserBuffer;
    if (hostBufferSizeMode == paUtilFixedHostBufferSize) {
      if (framesPerHostBuffer % framesPerUserBuffer == 0) {
        bp->useNonAdaptingProcess = 1;
LAB_00105eb6:
        bp->initialFramesInTempInputBuffer = 0;
        bp->initialFramesInTempOutputBuffer = 0;
        goto LAB_00105ebb;
      }
      bp->useNonAdaptingProcess = 0;
      uVar10 = framesPerUserBuffer;
      uVar4 = framesPerHostBuffer;
      if (outputChannelCount < 1 || inputChannelCount < 1) goto LAB_00105eb6;
      do {
        uVar3 = uVar10;
        uVar10 = uVar4 % uVar3;
        uVar4 = uVar3;
      } while (uVar10 != 0);
      uVar10 = 0;
      uVar3 = (framesPerHostBuffer * framesPerUserBuffer) / uVar3;
      if (framesPerHostBuffer < uVar3) {
        uVar10 = 0;
        uVar11 = framesPerHostBuffer;
        do {
          if (uVar10 <= uVar11 % framesPerUserBuffer) {
            uVar10 = uVar11 % framesPerUserBuffer;
          }
          uVar11 = uVar11 + framesPerHostBuffer;
        } while (uVar11 < uVar3);
      }
      if (framesPerUserBuffer <= framesPerHostBuffer) {
        bp->initialFramesInTempInputBuffer = 0;
        bp->initialFramesInTempOutputBuffer = uVar10;
        goto LAB_00105ebd;
      }
      bp->initialFramesInTempInputBuffer = uVar10;
      bp->initialFramesInTempOutputBuffer = 0;
      uVar4 = 0;
      goto LAB_00105ec0;
    }
    bp->useNonAdaptingProcess = 0;
    if (inputChannelCount < 1 || outputChannelCount < 1) goto LAB_00105eb6;
    bp->initialFramesInTempInputBuffer = 0;
    bp->initialFramesInTempOutputBuffer = framesPerUserBuffer;
    bp->framesInTempInputBuffer = 0;
    bp->framesInTempOutputBuffer = framesPerUserBuffer;
LAB_00105eef:
    local_58 = &bp->framesInTempInputBuffer;
    uVar2 = Pa_GetSampleSize(hostInputSampleFormat);
    if (0 < (int)uVar2) {
      bp->bytesPerHostInputSample = uVar2;
      uVar2 = Pa_GetSampleSize(userInputSampleFormat);
      if (0 < (int)uVar2) {
        uVar10 = streamFlags | 2;
        if ((streamFlags & 2) != 0) {
          uVar10 = streamFlags;
        }
        if ((hostInputSampleFormat & 2) == 0) {
          uVar10 = streamFlags;
        }
        bp->bytesPerUserInputSample = uVar2;
        if ((userInputSampleFormat & 4) == 0) {
          uVar10 = streamFlags;
        }
        pPVar5 = PaUtil_SelectConverter(hostInputSampleFormat,userInputSampleFormat,uVar10);
        bp->inputConverter = pPVar5;
        pPVar6 = PaUtil_SelectZeroer(hostInputSampleFormat);
        bp->inputZeroer = pPVar6;
        bp->userInputIsInterleaved = ~(uint)userInputSampleFormat >> 0x1f;
        bp->hostInputIsInterleaved = ~(uint)hostInputSampleFormat >> 0x1f;
        bp->userInputSampleFormatIsEqualToHost =
             (uint)(((hostInputSampleFormat ^ userInputSampleFormat) & 0xffffffff7fffffff) == 0);
        uVar10 = (ulong)(uint)inputChannelCount;
        sVar12 = bp->framesPerTempBuffer * uVar10 * (ulong)bp->bytesPerUserInputSample;
        pvVar7 = (void *)PaUtil_AllocateMemory(sVar12);
        bp->tempInputBuffer = pvVar7;
        if (pvVar7 == (void *)0x0) {
          uVar2 = 0xffffd8f8;
          goto LAB_001061a0;
        }
        if (*local_58 != 0) {
          memset(pvVar7,0,sVar12);
        }
        if ((int)(uint)userInputSampleFormat < 0) {
          ppvVar8 = (void **)PaUtil_AllocateMemory(uVar10 * 8);
          bp->tempInputBufferPtrs = ppvVar8;
          if (ppvVar8 != (void **)0x0) goto LAB_00105fe7;
        }
        else {
LAB_00105fe7:
          pPVar9 = (PaUtilChannelDescriptor *)PaUtil_AllocateMemory(uVar10 << 5);
          bp->hostInputChannels[0] = pPVar9;
          if (pPVar9 != (PaUtilChannelDescriptor *)0x0) {
            bp->hostInputChannels[1] = pPVar9 + uVar10;
            goto LAB_00106012;
          }
        }
        uVar2 = 0xffffd8f8;
      }
    }
  }
LAB_0010618f:
  if (bp->tempInputBuffer != (void *)0x0) {
    PaUtil_FreeMemory();
  }
LAB_001061a0:
  if (bp->tempInputBufferPtrs != (void **)0x0) {
    PaUtil_FreeMemory();
  }
  if (bp->hostInputChannels[0] != (PaUtilChannelDescriptor *)0x0) {
    PaUtil_FreeMemory();
  }
  if (bp->tempOutputBuffer != (void *)0x0) {
    PaUtil_FreeMemory();
  }
  if (bp->tempOutputBufferPtrs != (void **)0x0) {
    PaUtil_FreeMemory();
  }
  if (bp->hostOutputChannels[0] != (PaUtilChannelDescriptor *)0x0) {
    PaUtil_FreeMemory();
  }
  return uVar2;
}

Assistant:

PaError PaUtil_InitializeBufferProcessor( PaUtilBufferProcessor* bp,
        int inputChannelCount, PaSampleFormat userInputSampleFormat,
        PaSampleFormat hostInputSampleFormat,
        int outputChannelCount, PaSampleFormat userOutputSampleFormat,
        PaSampleFormat hostOutputSampleFormat,
        double sampleRate,
        PaStreamFlags streamFlags,
        unsigned long framesPerUserBuffer,
        unsigned long framesPerHostBuffer,
        PaUtilHostBufferSizeMode hostBufferSizeMode,
        PaStreamCallback *streamCallback, void *userData )
{
    PaError result = paNoError;
    PaError bytesPerSample;
    unsigned long tempInputBufferSize, tempOutputBufferSize;
    PaStreamFlags tempInputStreamFlags;

    if( streamFlags & paNeverDropInput )
    {
        /* paNeverDropInput is only valid for full-duplex callback streams, with an unspecified number of frames per buffer. */
        if( !streamCallback || !(inputChannelCount > 0 && outputChannelCount > 0) ||
                framesPerUserBuffer != paFramesPerBufferUnspecified )
            return paInvalidFlag;
    }

    /* initialize buffer ptrs to zero so they can be freed if necessary in error */
    bp->tempInputBuffer = 0;
    bp->tempInputBufferPtrs = 0;
    bp->tempOutputBuffer = 0;
    bp->tempOutputBufferPtrs = 0;

    bp->framesPerUserBuffer = framesPerUserBuffer;
    bp->framesPerHostBuffer = framesPerHostBuffer;

    bp->inputChannelCount = inputChannelCount;
    bp->outputChannelCount = outputChannelCount;

    bp->hostBufferSizeMode = hostBufferSizeMode;

    bp->hostInputChannels[0] = bp->hostInputChannels[1] = 0;
    bp->hostOutputChannels[0] = bp->hostOutputChannels[1] = 0;

    if( framesPerUserBuffer == 0 ) /* streamCallback will accept any buffer size */
    {
        bp->useNonAdaptingProcess = 1;
        bp->initialFramesInTempInputBuffer = 0;
        bp->initialFramesInTempOutputBuffer = 0;

        if( hostBufferSizeMode == paUtilFixedHostBufferSize
                || hostBufferSizeMode == paUtilBoundedHostBufferSize )
        {
            bp->framesPerTempBuffer = framesPerHostBuffer;
        }
        else /* unknown host buffer size */
        {
             bp->framesPerTempBuffer = PA_FRAMES_PER_TEMP_BUFFER_WHEN_HOST_BUFFER_SIZE_IS_UNKNOWN_;
        }
    }
    else
    {
        bp->framesPerTempBuffer = framesPerUserBuffer;

        if( hostBufferSizeMode == paUtilFixedHostBufferSize
                && framesPerHostBuffer % framesPerUserBuffer == 0 )
        {
            bp->useNonAdaptingProcess = 1;
            bp->initialFramesInTempInputBuffer = 0;
            bp->initialFramesInTempOutputBuffer = 0;
        }
        else
        {
            bp->useNonAdaptingProcess = 0;

            if( inputChannelCount > 0 && outputChannelCount > 0 )
            {
                /* full duplex */
                if( hostBufferSizeMode == paUtilFixedHostBufferSize )
                {
                    unsigned long frameShift =
                        CalculateFrameShift( framesPerHostBuffer, framesPerUserBuffer );

                    if( framesPerUserBuffer > framesPerHostBuffer )
                    {
                        bp->initialFramesInTempInputBuffer = frameShift;
                        bp->initialFramesInTempOutputBuffer = 0;
                    }
                    else
                    {
                        bp->initialFramesInTempInputBuffer = 0;
                        bp->initialFramesInTempOutputBuffer = frameShift;
                    }
                }
                else /* variable host buffer size, add framesPerUserBuffer latency */
                {
                    bp->initialFramesInTempInputBuffer = 0;
                    bp->initialFramesInTempOutputBuffer = framesPerUserBuffer;
                }
            }
            else
            {
                /* half duplex */
                bp->initialFramesInTempInputBuffer = 0;
                bp->initialFramesInTempOutputBuffer = 0;
            }
        }
    }


    bp->framesInTempInputBuffer = bp->initialFramesInTempInputBuffer;
    bp->framesInTempOutputBuffer = bp->initialFramesInTempOutputBuffer;

    
    if( inputChannelCount > 0 )
    {
        bytesPerSample = Pa_GetSampleSize( hostInputSampleFormat );
        if( bytesPerSample > 0 )
        {
            bp->bytesPerHostInputSample = bytesPerSample;
        }
        else
        {
            result = bytesPerSample;
            goto error;
        }

        bytesPerSample = Pa_GetSampleSize( userInputSampleFormat );
        if( bytesPerSample > 0 )
        {
            bp->bytesPerUserInputSample = bytesPerSample;
        }
        else
        {
            result = bytesPerSample;
            goto error;
        }

        /* Under the assumption that no ADC in existence delivers better than 24bits resolution,
            we disable dithering when host input format is paInt32 and user format is paInt24, 
            since the host samples will just be padded with zeros anyway. */

        tempInputStreamFlags = streamFlags;
        if( !(tempInputStreamFlags & paDitherOff) /* dither is on */
                && (hostInputSampleFormat & paInt32) /* host input format is int32 */
                && (userInputSampleFormat & paInt24) /* user requested format is int24 */ ){

            tempInputStreamFlags = tempInputStreamFlags | paDitherOff;
        }

        bp->inputConverter =
            PaUtil_SelectConverter( hostInputSampleFormat, userInputSampleFormat, tempInputStreamFlags );

        bp->inputZeroer = PaUtil_SelectZeroer( hostInputSampleFormat );
            
        bp->userInputIsInterleaved = (userInputSampleFormat & paNonInterleaved)?0:1;
		
        bp->hostInputIsInterleaved = (hostInputSampleFormat & paNonInterleaved)?0:1;

        bp->userInputSampleFormatIsEqualToHost = ((userInputSampleFormat & ~paNonInterleaved) == (hostInputSampleFormat & ~paNonInterleaved));

        tempInputBufferSize =
            bp->framesPerTempBuffer * bp->bytesPerUserInputSample * inputChannelCount;
         
        bp->tempInputBuffer = PaUtil_AllocateMemory( tempInputBufferSize );
        if( bp->tempInputBuffer == 0 )
        {
            result = paInsufficientMemory;
            goto error;
        }
        
        if( bp->framesInTempInputBuffer > 0 )
            memset( bp->tempInputBuffer, 0, tempInputBufferSize );

        if( userInputSampleFormat & paNonInterleaved )
        {
            bp->tempInputBufferPtrs =
                (void **)PaUtil_AllocateMemory( sizeof(void*)*inputChannelCount );
            if( bp->tempInputBufferPtrs == 0 )
            {
                result = paInsufficientMemory;
                goto error;
            }
        }

        bp->hostInputChannels[0] = (PaUtilChannelDescriptor*)
                PaUtil_AllocateMemory( sizeof(PaUtilChannelDescriptor) * inputChannelCount * 2);
        if( bp->hostInputChannels[0] == 0 )
        {
            result = paInsufficientMemory;
            goto error;
        }

        bp->hostInputChannels[1] = &bp->hostInputChannels[0][inputChannelCount];
    }

    if( outputChannelCount > 0 )
    {
        bytesPerSample = Pa_GetSampleSize( hostOutputSampleFormat );
        if( bytesPerSample > 0 )
        {
            bp->bytesPerHostOutputSample = bytesPerSample;
        }
        else
        {
            result = bytesPerSample;
            goto error;
        }

        bytesPerSample = Pa_GetSampleSize( userOutputSampleFormat );
        if( bytesPerSample > 0 )
        {
            bp->bytesPerUserOutputSample = bytesPerSample;
        }
        else
        {
            result = bytesPerSample;
            goto error;
        }

        bp->outputConverter =
            PaUtil_SelectConverter( userOutputSampleFormat, hostOutputSampleFormat, streamFlags );

        bp->outputZeroer = PaUtil_SelectZeroer( hostOutputSampleFormat );

        bp->userOutputIsInterleaved = (userOutputSampleFormat & paNonInterleaved)?0:1;

        bp->hostOutputIsInterleaved = (hostOutputSampleFormat & paNonInterleaved)?0:1;

        bp->userOutputSampleFormatIsEqualToHost = ((userOutputSampleFormat & ~paNonInterleaved) == (hostOutputSampleFormat & ~paNonInterleaved));

        tempOutputBufferSize =
                bp->framesPerTempBuffer * bp->bytesPerUserOutputSample * outputChannelCount;

        bp->tempOutputBuffer = PaUtil_AllocateMemory( tempOutputBufferSize );
        if( bp->tempOutputBuffer == 0 )
        {
            result = paInsufficientMemory;
            goto error;
        }

        if( bp->framesInTempOutputBuffer > 0 )
            memset( bp->tempOutputBuffer, 0, tempOutputBufferSize );
        
        if( userOutputSampleFormat & paNonInterleaved )
        {
            bp->tempOutputBufferPtrs =
                (void **)PaUtil_AllocateMemory( sizeof(void*)*outputChannelCount );
            if( bp->tempOutputBufferPtrs == 0 )
            {
                result = paInsufficientMemory;
                goto error;
            }
        }

        bp->hostOutputChannels[0] = (PaUtilChannelDescriptor*)
                PaUtil_AllocateMemory( sizeof(PaUtilChannelDescriptor)*outputChannelCount * 2 );
        if( bp->hostOutputChannels[0] == 0 )
        {                                                                     
            result = paInsufficientMemory;
            goto error;
        }

        bp->hostOutputChannels[1] = &bp->hostOutputChannels[0][outputChannelCount];
    }

    PaUtil_InitializeTriangularDitherState( &bp->ditherGenerator );

    bp->samplePeriod = 1. / sampleRate;

    bp->streamCallback = streamCallback;
    bp->userData = userData;

    return result;

error:
    if( bp->tempInputBuffer )
        PaUtil_FreeMemory( bp->tempInputBuffer );

    if( bp->tempInputBufferPtrs )
        PaUtil_FreeMemory( bp->tempInputBufferPtrs );

    if( bp->hostInputChannels[0] )
        PaUtil_FreeMemory( bp->hostInputChannels[0] );

    if( bp->tempOutputBuffer )
        PaUtil_FreeMemory( bp->tempOutputBuffer );

    if( bp->tempOutputBufferPtrs )
        PaUtil_FreeMemory( bp->tempOutputBufferPtrs );

    if( bp->hostOutputChannels[0] )
        PaUtil_FreeMemory( bp->hostOutputChannels[0] );

    return result;
}